

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_589d8e::BackendCollection::tryPopulateCollection(BackendCollection *this)

{
  QBasicMutex QVar1;
  QBasicAtomicInteger<signed_char> QVar2;
  Type *pTVar3;
  long lVar4;
  
  QVar2._q_value.super___atomic_base<signed_char>._M_i =
       QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>::guard._q_value.
       super___atomic_base<signed_char>._M_i;
  if (-2 < (char)QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>::guard.
                 _q_value.super___atomic_base<signed_char>._M_i) {
    QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>::
    instance();
    if ((AtomicType)tryPopulateCollection::mutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
      LOCK();
      tryPopulateCollection::mutex.d_ptr._q_value._M_b._M_p =
           (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
      UNLOCK();
    }
    else {
      QBasicMutex::lockInternal();
    }
    if ((this->backends).super__Vector_base<QTlsBackend_*,_std::allocator<QTlsBackend_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->backends).super__Vector_base<QTlsBackend_*,_std::allocator<QTlsBackend_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>::
      instance();
      QFactoryLoader::update();
      do {
        pTVar3 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>
                 ::instance();
        lVar4 = QFactoryLoader::instance((int)pTVar3);
      } while (lVar4 != 0);
    }
    QVar1.d_ptr._q_value._M_b._M_p = tryPopulateCollection::mutex.d_ptr._q_value._M_b._M_p;
    LOCK();
    tryPopulateCollection::mutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)QVar1.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex(&tryPopulateCollection::mutex);
    }
  }
  return -2 < (char)QVar2._q_value.super___atomic_base<signed_char>._M_i;
}

Assistant:

QString QTlsBackend::shortNameForId(int cid) const
{
    Q_UNUSED(cid);
    REPORT_MISSING_SUPPORT("does not support QSslEllipticCurve");
    return {};
}